

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_asn1.cc
# Opt level: O0

int BN_parse_asn1_unsigned(CBS *cbs,BIGNUM *ret)

{
  int iVar1;
  uint8_t *s;
  size_t sVar2;
  BIGNUM *pBVar3;
  int local_34;
  undefined1 local_30 [4];
  int is_negative;
  CBS child;
  BIGNUM *ret_local;
  CBS *cbs_local;
  
  child.len = (size_t)ret;
  iVar1 = CBS_get_asn1(cbs,(CBS *)local_30,2);
  if ((iVar1 != 0) && (iVar1 = CBS_is_valid_asn1_integer((CBS *)local_30,&local_34), iVar1 != 0)) {
    if (local_34 != 0) {
      ERR_put_error(3,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/bn_asn1.cc"
                    ,0x1f);
      return 0;
    }
    s = CBS_data((CBS *)local_30);
    sVar2 = CBS_len((CBS *)local_30);
    pBVar3 = BN_bin2bn(s,(int)sVar2,(BIGNUM *)child.len);
    return (uint)(pBVar3 != (BIGNUM *)0x0);
  }
  ERR_put_error(3,0,0x75,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/bn_asn1.cc"
                ,0x1a);
  return 0;
}

Assistant:

int BN_parse_asn1_unsigned(CBS *cbs, BIGNUM *ret) {
  CBS child;
  int is_negative;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_INTEGER) ||
      !CBS_is_valid_asn1_integer(&child, &is_negative)) {
    OPENSSL_PUT_ERROR(BN, BN_R_BAD_ENCODING);
    return 0;
  }

  if (is_negative) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }

  return BN_bin2bn(CBS_data(&child), CBS_len(&child), ret) != NULL;
}